

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

bool __thiscall doctest::AssertData::StringContains::check(StringContains *this,String *str)

{
  bool bVar1;
  int iVar2;
  
  if (this->isContains == true) {
    bVar1 = Contains::checkWith(&this->content,str);
    return bVar1;
  }
  iVar2 = String::compare((String *)this,str,false);
  return iVar2 == 0;
}

Assistant:

bool check(const String& str) { return isContains ? (content == str) : (content.string == str); }